

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::permuteTest<false>(ViewTest *this)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  value_type *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  reference piVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  logic_error *plVar11;
  code *pcVar12;
  size_t sVar13;
  undefined *puVar14;
  int *piVar15;
  size_t sVar16;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  View<int,_false,_std::allocator<unsigned_long>_> w3;
  View<int,_false,_std::allocator<unsigned_long>_> w4;
  View<int,_false,_std::allocator<unsigned_long>_> w5;
  undefined1 local_1d0 [16];
  size_t *local_1c0;
  size_t local_1a8;
  int *local_190;
  allocator_type local_181;
  undefined1 local_180 [16];
  size_t *local_170;
  size_t local_158;
  CoordinateOrder local_13c;
  undefined1 local_138 [16];
  size_t *local_128;
  size_t local_110;
  undefined1 local_f8 [16];
  size_t *local_e8;
  size_t local_d0;
  undefined1 local_b8 [16];
  size_t *local_a8;
  size_t local_90;
  undefined1 local_78 [16];
  size_t *local_68;
  size_t local_50;
  unsigned_long *local_38;
  
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  _Var6._M_current = _Var5._M_current + 2;
  *_Var5._M_current = 6;
  _Var5._M_current[1] = 4;
  piVar15 = this->data_;
  local_1d0._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  local_138._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_180);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_180._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_180 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
  _Var6._M_current = (unsigned_long *)operator_new(0x10);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 0;
  local_190 = piVar15;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_138,_Var6);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_180,_Var6);
  sVar16 = 0;
  do {
    sVar13 = 0;
    do {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1d0,sVar16,sVar13);
      iVar1 = *piVar7;
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_138,sVar13,sVar16);
      if (iVar1 != *piVar7) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1d0,sVar16,sVar13);
      iVar1 = *piVar7;
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_180,sVar16,sVar13);
      if (iVar1 != *piVar7) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(_Var6._M_current,0x10);
  operator_delete(local_170,local_158 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_1c0,local_1a8 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  _Var5._M_current = (unsigned_long *)operator_new(0x10);
  _Var6._M_current = _Var5._M_current + 2;
  *_Var5._M_current = 6;
  _Var5._M_current[1] = 4;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_1d0._0_8_ = local_190;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_180);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  piVar15 = local_190;
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = local_190;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_180,&andres::defaultOrder,(allocator_type *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_f8._0_8_ = (ulong)(uint)local_f8._4_4_ << 0x20;
  local_180._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_180 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_f8,&andres::defaultOrder,(allocator_type *)local_b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
  _Var6._M_current = (unsigned_long *)operator_new(0x10);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_138,_Var6);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_180,_Var6);
  sVar16 = 0;
  do {
    sVar13 = 0;
    do {
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1d0,sVar16,sVar13);
      iVar1 = *piVar7;
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_138,sVar13,sVar16);
      if (iVar1 != *piVar7) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1d0,sVar16,sVar13);
      iVar1 = *piVar7;
      piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_180,sVar16,sVar13);
      if (iVar1 != *piVar7) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(_Var6._M_current,0x10);
  operator_delete(local_170,local_158 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_1c0,local_1a8 * 0x18);
  operator_delete(_Var5._M_current,0x10);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  piVar15 = local_190;
  _Var6._M_current = _Var5._M_current + 3;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_1d0._0_8_ = local_190;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  local_138._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_180);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_180._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_180 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
  local_f8._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_b8._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_78);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
  local_78._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),_Var5,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_13c);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 1;
  _Var6._M_current[2] = 2;
  local_38 = _Var6._M_current;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_138,_Var6);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 0;
  _Var6._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_180,_Var6);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 2;
  _Var6._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_f8,_Var6);
  *_Var6._M_current = 2;
  _Var6._M_current[1] = 1;
  _Var6._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b8,_Var6);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 2;
  _Var6._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_78,_Var6);
  sVar16 = 0;
  do {
    sVar13 = 0;
    do {
      sVar10 = 0;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b07b6:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b07c4:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar3 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b07b6;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar13,
                           sVar10);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b07c4;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b073d:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0920:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
        uVar3 = local_180._0_8_;
        if (((int *)local_180._0_8_ == (int *)0x0) || (local_158 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b073d;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180,3,sVar16,
                           sVar10);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar13 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0920;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0962:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0970:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar3 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0962;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar10,
                           sVar13);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0970;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0853:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0861:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
        uVar3 = local_b8._0_8_;
        if (((int *)local_b8._0_8_ == (int *)0x0) || (local_90 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0853;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,3,sVar13,
                           sVar16);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar10 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0861;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b08e0:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b08ee:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78);
        uVar3 = local_78._0_8_;
        if (((int *)local_78._0_8_ == (int *)0x0) || (local_50 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b08e0;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78,0);
        sVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78,3,sVar10,
                            sVar16);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar13 + sVar10) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b08ee;
        }
        sVar10 = 1;
        bVar4 = false;
      } while (bVar2);
      sVar13 = sVar13 + 1;
    } while (sVar13 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 3);
  operator_delete(local_38,0x18);
  operator_delete(local_68,local_50 * 0x18);
  operator_delete(local_a8,local_90 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(local_170,local_158 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_1c0,local_1a8 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  _Var6._M_current = _Var5._M_current + 3;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_1d0._0_8_ = local_190;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_180);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  piVar15 = local_190;
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = local_190;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_180,&andres::defaultOrder,(allocator_type *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  local_180._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_180 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_f8,&andres::defaultOrder,(allocator_type *)local_b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_b8,&andres::defaultOrder,(allocator_type *)local_78);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
  local_b8._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),_Var5,_Var6,
             (CoordinateOrder *)local_78,&andres::defaultOrder,(allocator_type *)&local_13c);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
  local_13c = FirstMajorOrder;
  local_78._0_8_ = piVar15;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),_Var5,_Var6,&local_13c,
             &andres::defaultOrder,&local_181);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 1;
  _Var6._M_current[2] = 2;
  local_190 = (int *)_Var6._M_current;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_138,_Var6);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 0;
  _Var6._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_180,_Var6);
  *_Var6._M_current = 0;
  _Var6._M_current[1] = 2;
  _Var6._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_f8,_Var6);
  *_Var6._M_current = 2;
  _Var6._M_current[1] = 1;
  _Var6._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b8,_Var6);
  *_Var6._M_current = 1;
  _Var6._M_current[1] = 2;
  _Var6._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_78,_Var6);
  sVar16 = 0;
  do {
    sVar13 = 0;
    do {
      sVar10 = 0;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0a2b:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0a39:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar3 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0a2b;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar13,
                           sVar10);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0a39;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b09b2:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0b95:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
        uVar3 = local_180._0_8_;
        if (((int *)local_180._0_8_ == (int *)0x0) || (local_158 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b09b2;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180,3,sVar16,
                           sVar10);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar13 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0b95;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0bd7:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0be5:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar3 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0bd7;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar10,
                           sVar13);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0be5;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0ac8:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0ad6:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8);
        uVar3 = local_b8._0_8_;
        if (((int *)local_b8._0_8_ == (int *)0x0) || (local_90 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0ac8;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b8,3,sVar13,
                           sVar16);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar10 + sVar9) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0ad6;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
        uVar3 = local_1d0._0_8_;
        if (((int *)local_1d0._0_8_ == (int *)0x0) || (local_1a8 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
LAB_001b0b55:
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
LAB_001b0b63:
          __cxa_throw(plVar11,puVar14,pcVar12);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,3,sVar13,
                           sVar10);
        iVar1 = *(int *)(uVar3 + (sVar8 * sVar16 + sVar9) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78);
        uVar3 = local_78._0_8_;
        if (((int *)local_78._0_8_ == (int *)0x0) || (local_50 != 3)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          goto LAB_001b0b55;
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78,0);
        sVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_78,3,sVar10,
                            sVar16);
        if (iVar1 != *(int *)(uVar3 + (sVar8 * sVar13 + sVar10) * 4)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
          goto LAB_001b0b63;
        }
        sVar10 = 1;
        bVar4 = false;
      } while (bVar2);
      sVar13 = sVar13 + 1;
    } while (sVar13 != 4);
    sVar16 = sVar16 + 1;
    if (sVar16 == 3) {
      operator_delete(local_190,0x18);
      operator_delete(local_68,local_50 * 0x18);
      operator_delete(local_a8,local_90 * 0x18);
      operator_delete(local_e8,local_d0 * 0x18);
      operator_delete(local_170,local_158 * 0x18);
      operator_delete(local_128,local_110 * 0x18);
      operator_delete(local_1c0,local_1a8 * 0x18);
      operator_delete(_Var5._M_current,0x18);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::permuteTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    // 3D 
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
}